

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

float ImGui::CalcItemWidth(void)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (GImGui->CurrentWindow->DC).ItemWidth;
  if (fVar3 < 0.0) {
    IVar1 = GetContentRegionAvail();
    fVar2 = fVar3 + IVar1.x;
    fVar3 = 1.0;
    if (1.0 <= fVar2) {
      fVar3 = fVar2;
    }
  }
  return (float)(int)fVar3;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }